

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O1

void iutest::TestEnv::set_locale_ctype(char *str)

{
  char *pcVar1;
  Variable *pVVar2;
  char *__s;
  
  __s = "";
  if (str != (char *)0x0) {
    __s = str;
  }
  pVVar2 = get_vars();
  pcVar1 = (char *)(pVVar2->m_locale_ctype)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&pVVar2->m_locale_ctype,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

static bool IsEnableFlag(int flag) { return (GetInstance().m_test_flags & flag) ? true : false; }